

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

bool __thiscall CMutableTransaction::HasWitness(CMutableTransaction *this)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  ulong __n;
  undefined8 local_20;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0;
  do {
    __n = local_20;
    sVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                       CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (sVar3 <= __n) {
      local_9 = false;
LAB_0033207c:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_9;
      }
      __stack_chk_fail();
    }
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[](in_RDI,__n);
    bVar2 = CScriptWitness::IsNull
                      ((CScriptWitness *)
                       CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    if (!bVar2) {
      local_9 = true;
      goto LAB_0033207c;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool HasWitness() const
    {
        for (size_t i = 0; i < vin.size(); i++) {
            if (!vin[i].scriptWitness.IsNull()) {
                return true;
            }
        }
        return false;
    }